

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool __thiscall
tinyusdz::OverridePrimSpec(tinyusdz *this,PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream ss_e;
  ostringstream local_198 [376];
  
  if (dst->_specifier != Over) {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"OverridePrimSpec");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x534);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_198,
                               "src PrimSpec must be qualified with `over` specifier.\n");
    ::std::operator<<(poVar2,"\n");
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  bVar1 = detail::OverridePrimSpecRec(0,(PrimSpec *)this,dst,warn,err);
  return bVar1;
}

Assistant:

bool OverridePrimSpec(PrimSpec &dst, const PrimSpec &src, std::string *warn,
                      std::string *err) {
  if (src.specifier() != Specifier::Over) {
    PUSH_ERROR("src PrimSpec must be qualified with `over` specifier.\n");
  }

  return detail::OverridePrimSpecRec(0, dst, src, warn, err);
}